

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

bool __thiscall wallet::WalletInit::ParameterInteraction(WalletInit *this)

{
  bool bVar1;
  string *wallet;
  _Alloc_hider args_1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"-disablewallet",(allocator<char> *)&local_78);
  bVar1 = ArgsManager::GetBoolArg(&gArgs,&local_58,false);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"-wallet",&local_79);
    ArgsManager::GetArgs
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_78,&gArgs,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    for (args_1._M_p = local_78._M_dataplus._M_p; args_1._M_p != (pointer)local_78._M_string_length;
        args_1._M_p = args_1._M_p + 0x20) {
      logging_function._M_str = "ParameterInteraction";
      logging_function._M_len = 0x14;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/init.cpp"
      ;
      source_file._M_len = 0x5f;
      LogPrintFormatInternal<char[21],std::__cxx11::string>
                (logging_function,source_file,0x70,ALL,Info,(ConstevalFormatString<2U>)0x6ca33d,
                 (char (*) [21])0x683b73,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"-blocksonly",&local_79);
    bVar1 = ArgsManager::GetBoolArg(&gArgs,&local_58,false);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"-walletbroadcast",&local_7a);
      bVar1 = ArgsManager::SoftSetBoolArg(&gArgs,&local_78,false);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      if (bVar1) {
        logging_function_00._M_str = "ParameterInteraction";
        logging_function_00._M_len = 0x14;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/init.cpp"
        ;
        source_file_00._M_len = 0x5f;
        LogPrintFormatInternal<char[21]>
                  (logging_function_00,source_file_00,0x77,ALL,Info,
                   (ConstevalFormatString<1U>)0x6ca37f,(char (*) [21])0x683b73);
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletInit::ParameterInteraction() const
{
#ifdef USE_BDB
     if (!BerkeleyDatabaseSanityCheck()) {
         return InitError(Untranslated("A version conflict was detected between the run-time BerkeleyDB library and the one used during compilation."));
     }
#endif
    if (gArgs.GetBoolArg("-disablewallet", DEFAULT_DISABLE_WALLET)) {
        for (const std::string& wallet : gArgs.GetArgs("-wallet")) {
            LogPrintf("%s: parameter interaction: -disablewallet -> ignoring -wallet=%s\n", __func__, wallet);
        }

        return true;
    }

    if (gArgs.GetBoolArg("-blocksonly", DEFAULT_BLOCKSONLY) && gArgs.SoftSetBoolArg("-walletbroadcast", false)) {
        LogPrintf("%s: parameter interaction: -blocksonly=1 -> setting -walletbroadcast=0\n", __func__);
    }

    return true;
}